

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-callback-stack.c
# Opt level: O0

void timer_cb(uv_timer_t *handle)

{
  void *eval_b;
  void *eval_a;
  uv_timer_t *handle_local;
  
  if (handle != &timer) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-walk-handles.c"
            ,0x2d,"handle","==","&timer",handle,"==",&timer);
    abort();
  }
  uv_walk(timer.loop,walk_cb,magic_cookie);
  uv_close(&timer,0);
  return;
}

Assistant:

static void timer_cb(uv_timer_t* handle) {
  ASSERT_PTR_EQ(handle, &timer);
  ASSERT(nested == 0 && "timer_cb must be called from a fresh stack");

  puts("Timeout complete. Now read data...");

  nested++;
  if (uv_read_start((uv_stream_t*)&client, alloc_cb, read_cb)) {
    FATAL("uv_read_start failed");
  }
  nested--;

  timer_cb_called++;

  uv_close((uv_handle_t*)handle, close_cb);
}